

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish.cpp
# Opt level: O0

int __thiscall ncnn::HardSwish::load_param(HardSwish *this,ParamDict *pd)

{
  ParamDict *in_RSI;
  long in_RDI;
  float fVar1;
  
  fVar1 = ParamDict::get(in_RSI,0,0.2);
  *(float *)(in_RDI + 0xd0) = fVar1;
  fVar1 = ParamDict::get(in_RSI,1,0.5);
  *(float *)(in_RDI + 0xd4) = fVar1;
  *(float *)(in_RDI + 0xd8) = -*(float *)(in_RDI + 0xd4) / *(float *)(in_RDI + 0xd0);
  *(float *)(in_RDI + 0xdc) = 1.0 / *(float *)(in_RDI + 0xd0) + *(float *)(in_RDI + 0xd8);
  return 0;
}

Assistant:

int HardSwish::load_param(const ParamDict& pd)
{
    // Note that tensorflow/pytorch use alpha,beta = 1/6, 0.5, not the default value here.
    // You can setup them manually in .param file.
    alpha = pd.get(0, 0.2f);
    beta = pd.get(1, 0.5f);
    lower = -beta / alpha;
    upper = (1.f / alpha) + lower;

    return 0;
}